

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeSORegMemOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  undefined *Decoder_00;
  uint64_t Address_00;
  uint uVar4;
  DecodeStatus DVar5;
  uint uVar6;
  
  uVar4 = Val >> 7 & 0x1f;
  DVar5 = MCDisassembler_Fail;
  switch(Val >> 5 & 3) {
  case 0:
    uVar1 = 0x4000;
    break;
  case 1:
    uVar1 = 0x6000;
    break;
  case 2:
    uVar1 = 0x2000;
    break;
  case 3:
    uVar1 = 0x8000;
    Decoder_00 = &DAT_001cbe01;
    goto LAB_00151070;
  }
  Decoder_00 = (undefined *)0x0;
LAB_00151070:
  uVar6 = 0xa000;
  if ((char)Decoder_00 == '\0') {
    uVar6 = uVar1;
  }
  if (uVar4 != 0) {
    uVar6 = uVar1;
  }
  DVar2 = DecodeGPRRegisterClass(Inst,Val >> 0xd & 0xf,Address,Decoder_00);
  if ((DVar2 | 2) == MCDisassembler_Success) {
    DVar3 = DecodeGPRRegisterClass(Inst,Val & 0xf,Address_00,Decoder_00);
    DVar5 = DVar2;
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar5 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)((uVar6 | Val & 0x1000 | uVar4) ^ 0x1000));
  }
  return DVar5;
}

Assistant:

static DecodeStatus DecodeSORegMemOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_ShiftOpc ShOp;
	unsigned shift;
	unsigned Rn = fieldFromInstruction_4(Val, 13, 4);
	unsigned Rm = fieldFromInstruction_4(Val,  0, 4);
	unsigned type = fieldFromInstruction_4(Val, 5, 2);
	unsigned imm = fieldFromInstruction_4(Val, 7, 5);
	unsigned U = fieldFromInstruction_4(Val, 12, 1);

	ShOp = ARM_AM_lsl;
	switch (type) {
		case 0:
			ShOp = ARM_AM_lsl;
			break;
		case 1:
			ShOp = ARM_AM_lsr;
			break;
		case 2:
			ShOp = ARM_AM_asr;
			break;
		case 3:
			ShOp = ARM_AM_ror;
			break;
	}

	if (ShOp == ARM_AM_ror && imm == 0)
		ShOp = ARM_AM_rrx;

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (U)
		shift = ARM_AM_getAM2Opc(ARM_AM_add, imm, ShOp, 0);
	else
		shift = ARM_AM_getAM2Opc(ARM_AM_sub, imm, ShOp, 0);
	MCOperand_CreateImm0(Inst, shift);

	return S;
}